

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  pointer ppMVar1;
  bool bVar2;
  uint field_count;
  int iVar3;
  undefined7 extraout_var;
  FastFieldValuePrinter *pFVar4;
  Message *message_00;
  ulong uVar5;
  pointer ppMVar6;
  char *pcVar7;
  uint field_index;
  ulong uVar8;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  sorted_map_field;
  FieldDescriptor *local_68;
  undefined4 local_5c;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  local_58;
  FieldDescriptor *local_38;
  
  if ((this->use_short_repeated_primitives_ == true) && ((~(byte)field[1] & 0x60) == 0)) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_58.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)FieldDescriptor::TypeOnceInit;
      local_68 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_58,
                 &local_68);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 9) {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_58.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)FieldDescriptor::TypeOnceInit;
        local_68 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_58,
                   &local_68);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 10) {
        PrintShortRepeatedField(this,message,reflection,field,generator);
        return;
      }
    }
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    field_count = Reflection::FieldSize(reflection,message,field);
  }
  else {
    bVar2 = Reflection::HasField(reflection,message,field);
    if ((bVar2) ||
       (field_count = 0, *(char *)(*(long *)(*(long *)(field + 0x20) + 0x20) + 0x4b) == '\x01')) {
      field_count = 1;
    }
  }
  local_58.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_68 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
    local_38 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,&local_38)
    ;
  }
  if (field[2] == (FieldDescriptor)0xb) {
    bVar2 = FieldDescriptor::is_map_message_type(field);
    local_5c = (undefined4)CONCAT71(extraout_var,bVar2);
  }
  else {
    local_5c = 0;
  }
  if ((char)local_5c == '\0') {
    bVar2 = false;
  }
  else {
    bVar2 = internal::MapFieldPrinterHelper::SortMap(message,reflection,field,&local_58);
  }
  uVar5 = (ulong)field_count;
  if (0 < (int)field_count) {
    uVar8 = 0;
    do {
      field_index = -(uint)((~(byte)field[1] & 0x60) != 0) | (uint)uVar8;
      PrintFieldName(this,message,field_index,field_count,reflection,field,generator);
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_68 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_38 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,
                   &local_38);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) == 10) {
        pFVar4 = GetFieldPrinter(this,field);
        if ((~(byte)field[1] & 0x60) == 0) {
          if ((char)local_5c == '\0') {
            message_00 = Reflection::GetRepeatedMessage(reflection,message,field,(uint)uVar8);
          }
          else {
            message_00 = local_58.
                         super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar8];
          }
        }
        else {
          message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
        }
        (*pFVar4->_vptr_FastFieldValuePrinter[0xe])
                  (pFVar4,message_00,(ulong)field_index,uVar5,(ulong)this->single_line_mode_,
                   generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        iVar3 = (*pFVar4->_vptr_FastFieldValuePrinter[0xf])
                          (pFVar4,message_00,(ulong)field_index,uVar5,(ulong)this->single_line_mode_
                           ,generator);
        if ((char)iVar3 == '\0') {
          Print(this,message_00,generator);
        }
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])(generator);
        (*pFVar4->_vptr_FastFieldValuePrinter[0x10])
                  (pFVar4,message_00,(ulong)field_index,uVar5,(ulong)this->single_line_mode_,
                   generator);
      }
      else {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
        if (generator->insert_silent_marker_ == true) {
          generator->insert_silent_marker_ = false;
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,"\t ",2);
        }
        PrintFieldValue(this,message,reflection,field,field_index,generator);
        pcVar7 = "\n";
        if (this->single_line_mode_ != false) {
          pcVar7 = " ";
        }
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,pcVar7,1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  ppMVar1 = local_58.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppMVar6 = local_58.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (bVar2 != false) {
    for (; ppMVar6 != ppMVar1; ppMVar6 = ppMVar6 + 1) {
      if (*ppMVar6 != (Message *)0x0) {
        (*((*ppMVar6)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
  }
  if (local_58.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator* generator) const {
  if (use_short_repeated_primitives_ && field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field) ||
             field->containing_type()->options().map_entry()) {
    count = 1;
  }

  std::vector<const Message*> sorted_map_field;
  bool need_release = false;
  bool is_map = field->is_map();
  if (is_map) {
    need_release = internal::MapFieldPrinterHelper::SortMap(
        message, reflection, field, &sorted_map_field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, field_index, count, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FastFieldValuePrinter* printer = GetFieldPrinter(field);
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *sorted_map_field[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      printer->PrintMessageStart(sub_message, field_index, count,
                                 single_line_mode_, generator);
      generator->Indent();
      if (!printer->PrintMessageContent(sub_message, field_index, count,
                                        single_line_mode_, generator)) {
        Print(sub_message, generator);
      }
      generator->Outdent();
      printer->PrintMessageEnd(sub_message, field_index, count,
                               single_line_mode_, generator);
    } else {
      generator->PrintMaybeWithMarker(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator->PrintLiteral(" ");
      } else {
        generator->PrintLiteral("\n");
      }
    }
  }

  if (need_release) {
    for (const Message* message_to_delete : sorted_map_field) {
      delete message_to_delete;
    }
  }
}